

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int16 * acmod_score(acmod_t *acmod,int *inout_frame_idx)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int16 *piVar4;
  
  iVar1 = calc_frame_idx(acmod,inout_frame_idx);
  if (((acmod->compallsen == '\0') && (acmod->insenfh == (FILE *)0x0)) ||
     (iVar1 != acmod->senscr_frame)) {
    uVar2 = calc_feat_idx(acmod,iVar1);
    if (-1 < (int)uVar2) {
      if ((FILE *)acmod->insenfh == (FILE *)0x0) {
        acmod_flags2list(acmod);
        (*acmod->mgau->vt->frame_eval)
                  (acmod->mgau,acmod->senone_scores,acmod->senone_active,acmod->n_senone_active,
                   acmod->feat_buf[uVar2],iVar1,(int32)acmod->compallsen);
      }
      else {
        fseek((FILE *)acmod->insenfh,acmod->framepos[uVar2],0);
        iVar3 = acmod_read_scores_internal(acmod);
        if (iVar3 < 0) {
          return (int16 *)0x0;
        }
      }
      if (inout_frame_idx != (int *)0x0) {
        *inout_frame_idx = iVar1;
      }
      acmod->senscr_frame = iVar1;
      if ((acmod->senfh == (FILE *)0x0) ||
         (iVar1 = acmod_write_scores(acmod,acmod->n_senone_active,acmod->senone_active,
                                     acmod->senone_scores,acmod->senfh), -1 < iVar1))
      goto LAB_0011ab68;
    }
    piVar4 = (int16 *)0x0;
  }
  else {
    if (inout_frame_idx != (int *)0x0) {
      *inout_frame_idx = iVar1;
    }
LAB_0011ab68:
    piVar4 = acmod->senone_scores;
  }
  return piVar4;
}

Assistant:

int16 const *
acmod_score(acmod_t *acmod, int *inout_frame_idx)
{
    int frame_idx, feat_idx;

    /* Calculate the absolute frame index to be scored. */
    frame_idx = calc_frame_idx(acmod, inout_frame_idx);

    /* If all senones are being computed, or we are using a senone file,
       then we can reuse existing scores. */
    if ((acmod->compallsen || acmod->insenfh)
        && frame_idx == acmod->senscr_frame) {
        if (inout_frame_idx)
            *inout_frame_idx = frame_idx;
        return acmod->senone_scores;
    }

    /* Calculate position of requested frame in circular buffer. */
    if ((feat_idx = calc_feat_idx(acmod, frame_idx)) < 0)
        return NULL;

    /* If there is an input senone file locate the appropriate frame and read it. */
    if (acmod->insenfh) {
        fseek(acmod->insenfh, acmod->framepos[feat_idx], SEEK_SET);
        if (acmod_read_scores_internal(acmod) < 0)
            return NULL;
    }
    else {
        /* Build active senone list. */
        acmod_flags2list(acmod);

        /* Generate scores for the next available frame */
        ps_mgau_frame_eval(acmod->mgau,
                           acmod->senone_scores,
                           acmod->senone_active,
                           acmod->n_senone_active,
                           acmod->feat_buf[feat_idx],
                           frame_idx,
                           acmod->compallsen);
    }

    if (inout_frame_idx)
        *inout_frame_idx = frame_idx;
    acmod->senscr_frame = frame_idx;

    /* Dump scores to the senone dump file if one exists. */
    if (acmod->senfh) {
        if (acmod_write_scores(acmod, acmod->n_senone_active,
                               acmod->senone_active,
                               acmod->senone_scores,
                               acmod->senfh) < 0)
            return NULL;
        E_DEBUG("Frame %d has %d active states\n", frame_idx,
                acmod->n_senone_active);
    }

    return acmod->senone_scores;
}